

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O1

bool __thiscall duckdb::Transformer::ExpressionIsEmptyStar(Transformer *this,ParsedExpression *expr)

{
  StarExpression *pSVar1;
  
  if ((expr->super_BaseExpression).expression_class == STAR) {
    pSVar1 = BaseExpression::Cast<duckdb::StarExpression>(&expr->super_BaseExpression);
    return (bool)((pSVar1->replace_list)._M_h._M_element_count == 0 &
                 (pSVar1->exclude_list)._M_h._M_element_count == 0 & ~pSVar1->columns);
  }
  return false;
}

Assistant:

bool Transformer::ExpressionIsEmptyStar(ParsedExpression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::STAR) {
		return false;
	}
	auto &star = expr.Cast<StarExpression>();
	if (!star.columns && star.exclude_list.empty() && star.replace_list.empty()) {
		return true;
	}
	return false;
}